

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.h
# Opt level: O1

void __thiscall Minisat::Queue<unsigned_int>::insert(Queue<unsigned_int> *this,uint elem)

{
  long lVar1;
  int iVar2;
  uint *puVar3;
  long lVar4;
  long lVar5;
  vec<unsigned_int> tmp;
  vec<unsigned_int> local_28;
  
  iVar2 = this->end;
  this->end = iVar2 + 1;
  (this->buf).data[iVar2] = elem;
  iVar2 = (this->buf).sz;
  if (this->end == iVar2) {
    this->end = 0;
  }
  if (this->first == this->end) {
    local_28.data = (uint *)0x0;
    local_28.sz = 0;
    local_28.cap = 0;
    vec<unsigned_int>::growTo(&local_28,iVar2 * 3 + 1 >> 1);
    iVar2 = this->first;
    if (iVar2 < (this->buf).sz) {
      puVar3 = (this->buf).data;
      lVar5 = 0;
      do {
        lVar4 = lVar5 + 1;
        local_28.data[lVar5] = puVar3[iVar2 + lVar5];
        lVar1 = iVar2 + lVar5;
        lVar5 = lVar4;
      } while (lVar1 + 1 < (long)(this->buf).sz);
    }
    else {
      lVar4 = 0;
    }
    if (0 < this->end) {
      puVar3 = (this->buf).data;
      lVar5 = 0;
      do {
        local_28.data[lVar4 + lVar5] = puVar3[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->end);
    }
    this->first = 0;
    this->end = (this->buf).sz;
    puVar3 = (this->buf).data;
    if (puVar3 != (uint *)0x0) {
      (this->buf).sz = 0;
      free(puVar3);
      (this->buf).data = (uint *)0x0;
      (this->buf).cap = 0;
    }
    (this->buf).data = local_28.data;
    (this->buf).sz = local_28.sz;
    (this->buf).cap = local_28.cap;
  }
  return;
}

Assistant:

void insert(T elem)
    { // INVARIANT: buf[end] is always unused
        buf[end++] = elem;
        if (end == buf.size()) end = 0;
        if (first == end) { // Resize:
            vec<T> tmp((buf.size() * 3 + 1) >> 1);
            //**/printf("queue alloc: %d elems (%.1f MB)\n", tmp.size(), tmp.size() * sizeof(T) / 1000000.0);
            int i = 0;
            for (int j = first; j < buf.size(); j++) tmp[i++] = buf[j];
            for (int j = 0; j < end; j++) tmp[i++] = buf[j];
            first = 0;
            end = buf.size();
            tmp.moveTo(buf);
        }
    }